

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

bool __thiscall tcu::TestSessionExecutor::iterate(TestSessionExecutor *this)

{
  bool bVar1;
  State SVar2;
  TestNodeType TVar3;
  IterateResult IVar4;
  string *casePath;
  TestNode *pTVar5;
  IterateResult iterResult;
  TestCase *testCase_1;
  TestCase *testCase;
  TestPackage *testPackage;
  bool isEnter;
  TestNodeType nodeType;
  TestNode *curNode;
  State hierIterState;
  TestSessionExecutor *this_local;
  
  while( true ) {
    while( true ) {
      if (((this->m_abortSession ^ 0xffU) & 1) == 0) {
        return false;
      }
      if (this->m_state == STATE_TRAVERSE_HIERARCHY) break;
      if (this->m_state == STATE_EXECUTE_TEST_CASE) {
        pTVar5 = TestHierarchyIterator::getNode(&this->m_iterator);
        IVar4 = iterateTestCase(this,(TestCase *)pTVar5);
        if (IVar4 == STOP) {
          this->m_state = STATE_TRAVERSE_HIERARCHY;
        }
        return true;
      }
    }
    SVar2 = TestHierarchyIterator::getState(&this->m_iterator);
    if ((SVar2 != STATE_ENTER_NODE) && (SVar2 != STATE_LEAVE_NODE)) break;
    pTVar5 = TestHierarchyIterator::getNode(&this->m_iterator);
    TVar3 = TestNode::getNodeType(pTVar5);
    if (TVar3 == NODETYPE_PACKAGE) {
      if (SVar2 != STATE_ENTER_NODE) {
        leaveTestPackage(this,(TestPackage *)pTVar5);
      }
      else {
        enterTestPackage(this,(TestPackage *)pTVar5);
      }
    }
    else if ((TVar3 != NODETYPE_GROUP) && (TVar3 - NODETYPE_SELF_VALIDATE < 4)) {
      if (SVar2 != STATE_ENTER_NODE) {
        leaveTestCase(this,(TestCase *)pTVar5);
      }
      else {
        casePath = TestHierarchyIterator::getNodePath_abi_cxx11_(&this->m_iterator);
        bVar1 = enterTestCase(this,(TestCase *)pTVar5,casePath);
        if (bVar1) {
          this->m_state = STATE_EXECUTE_TEST_CASE;
        }
      }
    }
    TestHierarchyIterator::next(&this->m_iterator);
  }
  (this->m_status).isComplete = true;
  return false;
}

Assistant:

bool TestSessionExecutor::iterate (void)
{
	while (!m_abortSession)
	{
		switch (m_state)
		{
			case STATE_TRAVERSE_HIERARCHY:
			{
				const TestHierarchyIterator::State	hierIterState	= m_iterator.getState();

				if (hierIterState == TestHierarchyIterator::STATE_ENTER_NODE ||
					hierIterState == TestHierarchyIterator::STATE_LEAVE_NODE)
				{
					TestNode* const		curNode		= m_iterator.getNode();
					const TestNodeType	nodeType	= curNode->getNodeType();
					const bool			isEnter		= hierIterState == TestHierarchyIterator::STATE_ENTER_NODE;

					switch (nodeType)
					{
						case NODETYPE_PACKAGE:
						{
							TestPackage* const testPackage = static_cast<TestPackage*>(curNode);
							isEnter ? enterTestPackage(testPackage) : leaveTestPackage(testPackage);
							break;
						}

						case NODETYPE_GROUP:
							break; // nada

						case NODETYPE_SELF_VALIDATE:
						case NODETYPE_PERFORMANCE:
						case NODETYPE_CAPABILITY:
						case NODETYPE_ACCURACY:
						{
							TestCase* const testCase = static_cast<TestCase*>(curNode);

							if (isEnter)
							{
								if (enterTestCase(testCase, m_iterator.getNodePath()))
									m_state = STATE_EXECUTE_TEST_CASE;
								// else remain in TRAVERSING_HIERARCHY => node will be exited from in the next iteration
							}
							else
								leaveTestCase(testCase);

							break;
						}

						default:
							DE_ASSERT(false);
							break;
					}

					m_iterator.next();
					break;
				}
				else
				{
					DE_ASSERT(hierIterState == TestHierarchyIterator::STATE_FINISHED);
					m_status.isComplete = true;
					return false;
				}
			}

			case STATE_EXECUTE_TEST_CASE:
			{
				DE_ASSERT(m_iterator.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
						  isTestNodeTypeExecutable(m_iterator.getNode()->getNodeType()));

				TestCase* const					testCase	= static_cast<TestCase*>(m_iterator.getNode());
				const TestCase::IterateResult	iterResult	= iterateTestCase(testCase);

				if (iterResult == TestCase::STOP)
					m_state = STATE_TRAVERSE_HIERARCHY;

				return true;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	return false;
}